

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDVertex::GetBoundaryVertexEdges
          (ON_SubDVertex *this,ON_SubDEdgePtr *eptr0,ON_SubDEdgePtr *eptr1)

{
  bool bVar1;
  uint local_28;
  uint uStack_24;
  bool rc;
  uint vbi [2];
  ON_SubDEdgePtr *eptr1_local;
  ON_SubDEdgePtr *eptr0_local;
  ON_SubDVertex *this_local;
  
  vbi = (uint  [2])eptr1;
  memset(&local_28,0,8);
  bVar1 = GetBoundaryVertexEdgeIndices(this,&local_28,&stack0xffffffffffffffdc);
  if (bVar1) {
    if (eptr0 != (ON_SubDEdgePtr *)0x0) {
      eptr0->m_ptr = this->m_edges[local_28].m_ptr;
    }
    if (vbi != (uint  [2])0x0) {
      *(ON__UINT_PTR *)vbi = this->m_edges[uStack_24].m_ptr;
    }
  }
  else {
    if (eptr0 != (ON_SubDEdgePtr *)0x0) {
      eptr0->m_ptr = (ON__UINT_PTR)(ON_SubDEdgePtr)0x0;
    }
    if (vbi != (uint  [2])0x0) {
      *(ON__UINT_PTR *)vbi = 0;
    }
  }
  return bVar1;
}

Assistant:

bool ON_SubDVertex::GetBoundaryVertexEdges(
  ON_SubDEdgePtr* eptr0,
  ON_SubDEdgePtr* eptr1
) const
{
  unsigned int vbi[2] = {};
  const bool rc = GetBoundaryVertexEdgeIndices(&vbi[0], &vbi[1]);
  if (rc)
  {
    if (nullptr != eptr0)
      *eptr0 = m_edges[vbi[0]];
    if (nullptr != eptr1)
      *eptr1 = m_edges[vbi[1]];
  }
  else
  {
    if (nullptr != eptr0)
      *eptr0 = ON_SubDEdgePtr::Null;
    if (nullptr != eptr1)
      *eptr1 = ON_SubDEdgePtr::Null;
  }
  return rc;
}